

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

void __thiscall helics::apps::Clone::addSubscription(Clone *this,string_view key)

{
  string_view target;
  iterator iVar1;
  Input *__args;
  size_type sVar2;
  _Elt_pointer pIVar3;
  mapped_type *pmVar4;
  string *psVar5;
  int iVar6;
  InterfaceHandle subid;
  key_type local_3c;
  key_type local_38;
  key_type local_28;
  
  local_38._M_str = key._M_str;
  local_38._M_len = key._M_len;
  iVar1 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->subkeys)._M_t,&local_38);
  if (((_Rb_tree_header *)iVar1._M_node == &(this->subkeys)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar1._M_node[1]._M_left == -1)) {
    target._M_str = local_38._M_str;
    target._M_len = local_38._M_len;
    __args = helics::ValueFederate::registerSubscription
                       (&((this->super_App).fed.
                          super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ValueFederate,target,(string_view)ZEXT816(0));
    std::deque<helics::Input,std::allocator<helics::Input>>::emplace_back<helics::Input&>
              ((deque<helics::Input,std::allocator<helics::Input>> *)&this->subscriptions,__args);
    sVar2 = CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::size
                      (&this->subscriptions);
    iVar6 = (int)sVar2 + -1;
    pIVar3 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pIVar3 == (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pIVar3 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    local_3c.hid = pIVar3[-1].super_Interface.handle.hid;
    pmVar4 = CLI::std::
             map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
             ::operator[](&this->subids,&local_3c);
    *pmVar4 = iVar6;
    pIVar3 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pIVar3 == (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pIVar3 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    psVar5 = Input::getTarget_abi_cxx11_(pIVar3 + -1);
    local_28._M_str = (psVar5->_M_dataplus)._M_p;
    local_28._M_len = psVar5->_M_string_length;
    pmVar4 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](&this->subkeys,&local_28);
    *pmVar4 = iVar6;
  }
  return;
}

Assistant:

void Clone::addSubscription(std::string_view key)
{
    auto res = subkeys.find(key);
    if ((res == subkeys.end()) || (res->second == -1)) {
        subscriptions.emplace_back(fed->registerSubscription(key));
        auto index = static_cast<int>(subscriptions.size()) - 1;
        auto subid = subscriptions.back().getHandle();
        subids[subid] = index;  // this is a new element
        subkeys[subscriptions.back().getTarget()] = index;  // this is a potential replacement
    }
}